

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CacheInstArray(Fts5Cursor *pCsr)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  u8 *puVar7;
  int *piVar8;
  u8 **in_RDI;
  long in_FS_OFFSET;
  int nNewSize;
  int iBest;
  int *aInst;
  int i;
  int nInst;
  sqlite3_int64 nByte;
  int nCol;
  int nIter;
  Fts5PoslistReader *aIter;
  int n;
  u8 *a;
  int rc;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  int local_54;
  int local_48;
  int local_44;
  int *pn;
  int local_c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0;
  iVar1 = *(int *)(*(long *)(*in_RDI + 0x18) + 0x20);
  iVar4 = sqlite3Fts5ExprPhraseCount((Fts5Expr *)in_RDI[8]);
  if (in_RDI[0x14] == (u8 *)0x0) {
    puVar7 = (u8 *)sqlite3Fts5MallocZero
                             ((int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    in_RDI[0x14] = puVar7;
  }
  pn = (int *)in_RDI[0x14];
  if (pn != (int *)0x0) {
    local_44 = 0;
    local_48 = 0;
    while( true ) {
      uVar3 = in_stack_ffffffffffffffa4 & 0xffffff;
      if (local_48 < iVar4) {
        uVar3 = CONCAT13(local_c == 0,(int3)in_stack_ffffffffffffffa4);
      }
      in_stack_ffffffffffffffa4 = uVar3;
      if ((char)(in_stack_ffffffffffffffa4 >> 0x18) == '\0') break;
      local_c = fts5CsrPoslist((Fts5Cursor *)&DAT_aaaaaaaaaaaaaaaa,-0x55555556,in_RDI,pn);
      if (local_c == 0) {
        sqlite3Fts5PoslistReaderInit
                  ((u8 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c,(Fts5PoslistReader *)0x284faa);
      }
      local_48 = local_48 + 1;
    }
    if (local_c == 0) {
      while( true ) {
        local_54 = -1;
        for (local_48 = 0; local_48 < iVar4; local_48 = local_48 + 1) {
          if ((*(char *)((long)pn + (long)local_48 * 0x20 + 0x11) == '\0') &&
             ((local_54 < 0 ||
              (*(long *)(pn + (long)local_48 * 8 + 6) < *(long *)(pn + (long)local_54 * 8 + 6))))) {
            local_54 = local_48;
          }
        }
        if (local_54 < 0) goto LAB_002851d0;
        iVar5 = local_44 + 1;
        if (*(int *)(in_RDI + 0x15) <= iVar5) {
          if (*(int *)(in_RDI + 0x15) == 0) {
            iVar6 = 0x20;
          }
          else {
            iVar6 = *(int *)(in_RDI + 0x15) << 1;
          }
          puVar7 = (u8 *)sqlite3_realloc64((void *)CONCAT44(in_stack_ffffffffffffff9c,
                                                            in_stack_ffffffffffffff98),0x2850d4);
          if (puVar7 == (u8 *)0x0) {
            local_c = 7;
            goto LAB_002851d0;
          }
          in_RDI[0x16] = puVar7;
          *(int *)(in_RDI + 0x15) = iVar6;
        }
        piVar8 = (int *)(in_RDI[0x16] + (long)(local_44 * 3) * 4);
        *piVar8 = local_54;
        piVar8[1] = (uint)((ulong)*(undefined8 *)(pn + (long)local_54 * 8 + 6) >> 0x20) & 0x7fffffff
        ;
        piVar8[2] = (uint)*(undefined8 *)(pn + (long)local_54 * 8 + 6) & 0x7fffffff;
        local_44 = iVar5;
        if (iVar1 <= piVar8[1]) break;
        sqlite3Fts5PoslistReaderNext((Fts5PoslistReader *)0x2851c9);
      }
      local_c = 0x10b;
    }
LAB_002851d0:
    *(int *)((long)in_RDI + 0xac) = local_44;
    *(uint *)(in_RDI + 10) = *(uint *)(in_RDI + 10) & 0xfffffff7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

static int fts5CacheInstArray(Fts5Cursor *pCsr){
  int rc = SQLITE_OK;
  Fts5PoslistReader *aIter;       /* One iterator for each phrase */
  int nIter;                      /* Number of iterators/phrases */
  int nCol = ((Fts5Table*)pCsr->base.pVtab)->pConfig->nCol;

  nIter = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  if( pCsr->aInstIter==0 ){
    sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nIter;
    pCsr->aInstIter = (Fts5PoslistReader*)sqlite3Fts5MallocZero(&rc, nByte);
  }
  aIter = pCsr->aInstIter;

  if( aIter ){
    int nInst = 0;                /* Number instances seen so far */
    int i;

    /* Initialize all iterators */
    for(i=0; i<nIter && rc==SQLITE_OK; i++){
      const u8 *a;
      int n;
      rc = fts5CsrPoslist(pCsr, i, &a, &n);
      if( rc==SQLITE_OK ){
        sqlite3Fts5PoslistReaderInit(a, n, &aIter[i]);
      }
    }

    if( rc==SQLITE_OK ){
      while( 1 ){
        int *aInst;
        int iBest = -1;
        for(i=0; i<nIter; i++){
          if( (aIter[i].bEof==0)
              && (iBest<0 || aIter[i].iPos<aIter[iBest].iPos)
            ){
            iBest = i;
          }
        }
        if( iBest<0 ) break;

        nInst++;
        if( nInst>=pCsr->nInstAlloc ){
          int nNewSize = pCsr->nInstAlloc ? pCsr->nInstAlloc*2 : 32;
          aInst = (int*)sqlite3_realloc64(
              pCsr->aInst, nNewSize*sizeof(int)*3
              );
          if( aInst ){
            pCsr->aInst = aInst;
            pCsr->nInstAlloc = nNewSize;
          }else{
            nInst--;
            rc = SQLITE_NOMEM;
            break;
          }
        }

        aInst = &pCsr->aInst[3 * (nInst-1)];
        aInst[0] = iBest;
        aInst[1] = FTS5_POS2COLUMN(aIter[iBest].iPos);
        aInst[2] = FTS5_POS2OFFSET(aIter[iBest].iPos);
        assert( aInst[1]>=0 );
        if( aInst[1]>=nCol ){
          rc = FTS5_CORRUPT;
          break;
        }
        sqlite3Fts5PoslistReaderNext(&aIter[iBest]);
      }
    }

    pCsr->nInstCount = nInst;
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_INST);
  }
  return rc;
}